

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::reserve(Tree *this,size_t cap)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  NodeData *pNVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  size_t first;
  byte bVar15;
  csubstr cVar16;
  char msg [33];
  char *pcStack_d0;
  size_t local_c8;
  char *pcStack_a8;
  size_t local_a0;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_30;
  size_t local_28;
  
  bVar15 = 0;
  if (this->m_cap < cap) {
    pNVar9 = (NodeData *)
             (*(this->m_callbacks).m_allocate)
                       (cap * 0x90,this->m_buf,(this->m_callbacks).m_user_data);
    if (this->m_buf != (NodeData *)0x0) {
      memcpy(pNVar9,this->m_buf,this->m_cap * 0x90);
      (*(this->m_callbacks).m_free)(this->m_buf,this->m_cap * 0x90,(this->m_callbacks).m_user_data);
    }
    first = this->m_cap;
    this->m_cap = cap;
    this->m_buf = pNVar9;
    _clear_range(this,first,cap - first);
    if (this->m_free_head == 0xffffffffffffffff) {
      if (this->m_free_tail != 0xffffffffffffffff) {
        msg[0x10] = '_';
        msg[0x11] = 'f';
        msg[0x12] = 'r';
        msg[0x13] = 'e';
        msg[0x14] = 'e';
        msg[0x15] = '_';
        msg[0x16] = 't';
        msg[0x17] = 'a';
        msg[0x18] = 'i';
        msg[0x19] = 'l';
        msg[0x1a] = ' ';
        msg[0x1b] = '=';
        msg[0x1c] = '=';
        msg[0x1d] = ' ';
        msg[0x1e] = 'N';
        msg[0x1f] = 'O';
        msg[0] = 'c';
        msg[1] = 'h';
        msg[2] = 'e';
        msg[3] = 'c';
        msg[4] = 'k';
        msg[5] = ' ';
        msg[6] = 'f';
        msg[7] = 'a';
        msg[8] = 'i';
        msg[9] = 'l';
        msg[10] = 'e';
        msg[0xb] = 'd';
        msg[0xc] = ':';
        msg[0xd] = ' ';
        msg[0xe] = '(';
        msg[0xf] = 'm';
        stack0xfffffffffffffee8 = 0x29454e;
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_78 = cVar16.len;
        pcStack_80 = cVar16.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6340) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x6340) << 0x40,8);
        LVar5.name.str = pcStack_80;
        LVar5.name.len = local_78;
        (*p_Var1)(msg,0x24,LVar5,(this->m_callbacks).m_user_data);
      }
      this->m_free_head = first;
      this->m_free_tail = cap - 1;
    }
    else {
      if (this->m_buf == (NodeData *)0x0) {
        builtin_strncpy(msg + 0x10,"_buf != nullptr)",0x10);
        builtin_strncpy(msg,"check failed: (m",0x10);
        stack0xfffffffffffffee8 = stack0xfffffffffffffee8 & 0xffffff00;
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_28 = cVar16.len;
        pcStack_30 = cVar16.str;
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6338) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x6338) << 0x40,8);
        LVar3.name.str = pcStack_30;
        LVar3.name.len = local_28;
        (*p_Var1)(msg,0x21,LVar3,(this->m_callbacks).m_user_data);
      }
      sVar10 = this->m_free_tail;
      if (sVar10 == 0xffffffffffffffff) {
        msg[0x10] = '_';
        msg[0x11] = 'f';
        msg[0x12] = 'r';
        msg[0x13] = 'e';
        msg[0x14] = 'e';
        msg[0x15] = '_';
        msg[0x16] = 't';
        msg[0x17] = 'a';
        msg[0x18] = 'i';
        msg[0x19] = 'l';
        msg[0x1a] = ' ';
        msg[0x1b] = '!';
        msg[0x1c] = '=';
        msg[0x1d] = ' ';
        msg[0x1e] = 'N';
        msg[0x1f] = 'O';
        msg[0] = 'c';
        msg[1] = 'h';
        msg[2] = 'e';
        msg[3] = 'c';
        msg[4] = 'k';
        msg[5] = ' ';
        msg[6] = 'f';
        msg[7] = 'a';
        msg[8] = 'i';
        msg[9] = 'l';
        msg[10] = 'e';
        msg[0xb] = 'd';
        msg[0xc] = ':';
        msg[0xd] = ' ';
        msg[0xe] = '(';
        msg[0xf] = 'm';
        stack0xfffffffffffffee8 = 0x29454e;
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_50 = cVar16.len;
        pcStack_58 = cVar16.str;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6339) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x6339) << 0x40,8);
        LVar4.name.str = pcStack_58;
        LVar4.name.len = local_50;
        (*p_Var1)(msg,0x24,LVar4,(this->m_callbacks).m_user_data);
        sVar10 = this->m_free_tail;
      }
      pNVar9 = this->m_buf;
      pNVar9[sVar10].m_next_sibling = first;
      pNVar9[first].m_prev_sibling = sVar10;
      this->m_free_tail = cap - 1;
      first = this->m_free_head;
    }
    uVar11 = cap - 1;
    if (cap <= first && first != 0xffffffffffffffff) {
      pcVar13 = "check failed: (m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap))";
      pcVar14 = msg;
      for (lVar12 = 0x4f; lVar12 != 0; lVar12 = lVar12 + -1) {
        *pcVar14 = *pcVar13;
        pcVar13 = pcVar13 + (ulong)bVar15 * -2 + 1;
        pcVar14 = pcVar14 + (ulong)bVar15 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_a0 = cVar16.len;
      pcStack_a8 = cVar16.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6344) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6344) << 0x40,8);
      LVar6.name.str = pcStack_a8;
      LVar6.name.len = local_a0;
      (*p_Var1)(msg,0x4f,LVar6,(this->m_callbacks).m_user_data);
      uVar11 = this->m_free_tail;
    }
    if (cap <= uVar11 && uVar11 != 0xffffffffffffffff) {
      pcVar13 = "check failed: (m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap))";
      pcVar14 = msg;
      for (lVar12 = 0x4f; lVar12 != 0; lVar12 = lVar12 + -1) {
        *pcVar14 = *pcVar13;
        pcVar13 = pcVar13 + (ulong)bVar15 * -2 + 1;
        pcVar14 = pcVar14 + (ulong)bVar15 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_c8 = cVar16.len;
      pcStack_d0 = cVar16.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6345) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6345) << 0x40,8);
      LVar7.name.str = pcStack_d0;
      LVar7.name.len = local_c8;
      (*p_Var1)(msg,0x4f,LVar7,(this->m_callbacks).m_user_data);
    }
    if (this->m_size == 0) {
      _claim_root(this);
    }
  }
  return;
}

Assistant:

void Tree::reserve(size_t cap)
{
    if(cap > m_cap)
    {
        NodeData *buf = _RYML_CB_ALLOC_HINT(m_callbacks, NodeData, cap, m_buf);
        if(m_buf)
        {
            memcpy(buf, m_buf, m_cap * sizeof(NodeData));
            _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
        }
        size_t first = m_cap, del = cap - m_cap;
        m_cap = cap;
        m_buf = buf;
        _clear_range(first, del);
        if(m_free_head != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, m_buf != nullptr);
            _RYML_CB_ASSERT(m_callbacks, m_free_tail != NONE);
            m_buf[m_free_tail].m_next_sibling = first;
            m_buf[first].m_prev_sibling = m_free_tail;
            m_free_tail = cap-1;
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE);
            m_free_head = first;
            m_free_tail = cap-1;
        }
        _RYML_CB_ASSERT(m_callbacks, m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap));
        _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap));

        if( ! m_size)
            _claim_root();
    }
}